

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* Path::protocol_split
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *path)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long local_70;
  size_type index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *path_local;
  
  local_18 = path;
  path_local = &__return_storage_ptr__->first;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_70 = std::__cxx11::string::find((char *)local_18,0x1bff34);
    if (local_70 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_90,"",&local_91);
      std::make_pair<std::__cxx11::string,std::__cxx11::string_const&>
                (__return_storage_ptr__,&local_90,local_18);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)local_18);
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)local_18);
      std::make_pair<std::__cxx11::string,std::__cxx11::string>
                (__return_storage_ptr__,&local_b8,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"",(allocator *)((long)&index + 7));
    std::make_pair<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,&local_38,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)((long)&index + 7));
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

pair<string, string> protocol_split(const string &path)
{
	if (path.empty())
		return make_pair(string(""), string(""));

	auto index = path.find("://");
	if (index == string::npos)
		return make_pair(string(""), path);

	return make_pair(path.substr(0, index), path.substr(index + 3, string::npos));
}